

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

string * __thiscall
Kernel::Clause::literalsOnlyToString_abi_cxx11_(string *__return_storage_ptr__,Clause *this)

{
  long lVar1;
  string sStack_48;
  
  if ((*(uint *)&this->field_0x38 & 0xfffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"$false",(allocator<char> *)&sStack_48);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    Literal::toString_abi_cxx11_(&sStack_48,this->_literals[0]);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    for (lVar1 = 0xf; lVar1 - 0xeU < (ulong)((uint)*(undefined8 *)&this->field_0x38 & 0xfffff);
        lVar1 = lVar1 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Literal::toString_abi_cxx11_(&sStack_48,this->_literals[lVar1 + -0xe]);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Clause::literalsOnlyToString() const
{
  if (_length == 0) {
    return "$false";
  } else {
    std::string result;
    result += _literals[0]->toString();
    for(unsigned i = 1; i < _length; i++) {
      result += " | ";
      result += _literals[i]->toString();
    }
    return result;
  }
}